

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

Vector3d * __thiscall OpenMD::Molecule::getPrevCom(Vector3d *__return_storage_ptr__,Molecule *this)

{
  double s;
  int extraout_EDX;
  int __denom;
  int extraout_EDX_00;
  StuntDouble *this_00;
  pointer ppSVar1;
  Vector<double,_3U> local_58;
  Vector<double,_3U> local_40;
  
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  ppSVar1 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __denom = extraout_EDX;
  if (ppSVar1 !=
      (this->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001e4f84;
  this_00 = (StuntDouble *)0x0;
  do {
    do {
      if (this_00 == (StuntDouble *)0x0) {
        Vector<double,_3U>::div(&__return_storage_ptr__->super_Vector<double,_3U>,0,__denom);
        return __return_storage_ptr__;
      }
      s = this_00->mass_;
      StuntDouble::getPrevPos((Vector3d *)&local_58,this_00);
      operator*(&local_40,&local_58,s);
      Vector<double,_3U>::add(&__return_storage_ptr__->super_Vector<double,_3U>,&local_40);
      ppSVar1 = ppSVar1 + 1;
      this_00 = (StuntDouble *)0x0;
      __denom = extraout_EDX_00;
    } while (ppSVar1 ==
             (this->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
LAB_001e4f84:
    this_00 = *ppSVar1;
  } while( true );
}

Assistant:

Vector3d Molecule::getPrevCom() {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;
    Vector3d com {};
    RealType totalMass {};
    RealType mass {};

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      mass = sd->getMass();
      totalMass += mass;
      com += sd->getPrevPos() * mass;
    }

    com /= totalMass;

    return com;
  }